

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::Mode5TransponderBasicData
          (Mode5TransponderBasicData *this,Mode5TransponderStatus *S,
          KUINT16 PersonalIdentificationNumber,KUINT32 MsgFormats,EnhancedMode1Code *EMC1,
          KUINT16 NationalOrigin,Mode5TransponderSupplementalData *SD,NavigationSource NS,
          KUINT8 FigureOfMerit)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5TransponderBasicData_00226b88;
  Mode5TransponderStatus::Mode5TransponderStatus(&this->m_Status);
  this->m_ui16PIN = PersonalIdentificationNumber;
  this->m_ui32MsgFormats = MsgFormats;
  EnhancedMode1Code::EnhancedMode1Code(&this->m_EM1Code);
  this->m_ui16NationalOrigin = NationalOrigin;
  Mode5TransponderSupplementalData::Mode5TransponderSupplementalData(&this->m_SupplementalData);
  this->m_ui8NavSrc = (KUINT8)NS;
  this->m_ui8FigMerit = FigureOfMerit;
  this->m_ui8Padding = '\0';
  (this->m_Status).m_StatusUnion = S->m_StatusUnion;
  (this->m_EM1Code).super_ModeXCodeRecord.m_CodeUnion = (EMC1->super_ModeXCodeRecord).m_CodeUnion;
  (this->m_SupplementalData).m_SupplementalDataUnion = SD->m_SupplementalDataUnion;
  return;
}

Assistant:

Mode5TransponderBasicData::Mode5TransponderBasicData( const Mode5TransponderStatus & S, KUINT16 PersonalIdentificationNumber, KUINT32 MsgFormats,
                                                      const EnhancedMode1Code & EMC1, KUINT16 NationalOrigin, Mode5TransponderSupplementalData SD,
                                                      KDIS::DATA_TYPE::ENUMS::NavigationSource NS, KUINT8 FigureOfMerit ) :
    m_ui16PIN( PersonalIdentificationNumber ),
    m_ui32MsgFormats( MsgFormats ),
    m_ui16NationalOrigin( NationalOrigin ),
    m_ui8NavSrc( NS ),
    m_ui8FigMerit( FigureOfMerit ),
    m_ui8Padding( 0 )
{
    m_Status = S;
    m_EM1Code = EMC1;
    m_SupplementalData = SD;
}